

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O0

SeedBuilder * tcu::operator<<(SeedBuilder *builder,deUint8 value)

{
  byte local_12;
  deUint8 local_11;
  deUint8 val;
  SeedBuilder *pSStack_10;
  deUint8 value_local;
  SeedBuilder *builder_local;
  
  local_12 = value ^ 0x8c;
  local_11 = value;
  pSStack_10 = builder;
  SeedBuilder::feed(builder,1,&local_12);
  return pSStack_10;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, deUint8 value)
{
	const deUint8 val = value ^ 140u;

	builder.feed(sizeof(val), &val);
	return builder;
}